

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_table_calculation.cpp
# Opt level: O3

void __thiscall
ParseTableCalculation::printItemSets
          (ParseTableCalculation *this,
          list<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
          *item_sets)

{
  _Rb_tree_color _Var1;
  ostream *poVar2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  pointer pvVar5;
  int iVar6;
  ulong uVar7;
  _List_node_base *p_Var8;
  long lVar9;
  int iVar10;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Item sets",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  p_Var8 = (item_sets->
           super__List_base<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var8 != (_List_node_base *)item_sets) {
    iVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tState [",8);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\n",2);
      for (p_Var4 = (_Rb_tree_node_base *)p_Var8[2]._M_prev;
          p_Var4 != (_Rb_tree_node_base *)&p_Var8[1]._M_prev;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
        lVar3 = (long)(int)p_Var4[1]._M_color;
        pvVar5 = (this->rules_).
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar6 = (int)((ulong)((long)*(pointer *)
                                     ((long)&pvVar5[lVar3].
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                             *(long *)&pvVar5[lVar3].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data) >> 5);
        if (0 < iVar6) {
          lVar9 = 8;
          uVar7 = 0;
          do {
            _Var1 = (_Rb_tree_color)lVar3;
            if (uVar7 == *(uint *)&p_Var4[1].field_0x4) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
              _Var1 = p_Var4[1]._M_color;
              pvVar5 = (this->rules_).
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            lVar3 = *(long *)&pvVar5[(int)_Var1].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,*(char **)(lVar3 + -8 + lVar9),
                                *(long *)(lVar3 + lVar9));
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            uVar7 = uVar7 + 1;
            lVar3 = (long)(int)p_Var4[1]._M_color;
            pvVar5 = (this->rules_).
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar6 = (int)((ulong)((long)*(pointer *)
                                         ((long)&pvVar5[lVar3].
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&pvVar5[lVar3].
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data) >> 5);
            lVar9 = lVar9 + 0x20;
          } while ((long)uVar7 < (long)iVar6);
        }
        if (*(int *)&p_Var4[1].field_0x4 == iVar6) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)p_Var4[1]._M_parent,
                            (long)p_Var4[1]._M_left);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      iVar10 = iVar10 + 1;
      p_Var8 = (((_List_base<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
                  *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var8 != (_List_node_base *)item_sets);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void ParseTableCalculation::printItemSets(const std::list<std::set<Item>>& item_sets)
{
	int i = 0;
	std::cout << "Item sets" << std::endl;
	for (auto& set : item_sets)
	{
		std::cout << "\tState [" << i << "]\n";
		for (const Item& item : set)
		{
			std::cout << "\t\t";
			for (int i = 0; i < static_cast<int>(rules_[item.ruleIndex].size()); ++i)
			{
				if (i == item.dotPosition)
				{
					std::cout << ".";
				}
				std::cout << rules_[item.ruleIndex][i] << " ";
			}
			if (item.dotPosition == static_cast<int>(rules_[item.ruleIndex].size()))
			{
				std::cout << ".";
			}
			std::cout << " | " << item.lookahead << std::endl;
		}
		std::cout << std::endl;
		++i;
	}
	std::cout << std::endl;
}